

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O2

void bson_decimal128_to_string(bson_decimal128_t *dec,char *str)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  uint32_t *__s;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  uint32_t significand [36];
  ulong uVar15;
  
  __s = significand;
  memset(__s,0,0x90);
  uVar4 = dec->high;
  pcVar6 = str;
  if ((long)uVar4 < 0) {
    pcVar6 = str + 1;
    *str = '-';
    uVar4 = dec->high;
  }
  uVar3 = dec->low;
  uVar14 = (uint)(uVar4 >> 0x20);
  if ((~uVar14 & 0x60000000) == 0) {
    uVar7 = uVar14 >> 0x1a & 0x1f;
    if (uVar7 == 0x1f) {
      builtin_strncpy(str,"NaN",4);
      return;
    }
    if (uVar7 == 0x1e) {
      builtin_strncpy(pcVar6,"Infinity",9);
      return;
    }
    uVar7 = uVar14 >> 0xf;
    uVar8 = uVar14 >> 0xe & 1 | 8;
  }
  else {
    uVar8 = uVar14 >> 0xe & 7;
    uVar7 = uVar14 >> 0x11;
  }
  uVar7 = uVar7 & 0x3fff;
  uVar10 = uVar7 - 0x1820;
  uVar14 = uVar8 << 0xe | uVar14 & 0x3fff;
  uVar15 = (ulong)uVar14;
  uVar12 = uVar3 << 0x20 | uVar3 >> 0x20;
  if ((uVar8 < 8) &&
     ((int)uVar3 != 0 || (((int)(uVar3 >> 0x20) != 0 || (int)uVar4 != 0) || uVar14 != 0))) {
    local_d8 = (ulong)uVar10;
    local_d0 = str;
    uVar14 = 0x23;
    for (iVar9 = 3; -1 < iVar9; iVar9 = iVar9 + -1) {
      local_e8 = uVar15 & 0xffffffff | uVar4 << 0x20;
      local_e0 = uVar12;
      if (local_e8 == 0 && uVar12 == 0) {
        uVar12 = 0;
        uVar15 = 0;
        uVar4 = 0;
      }
      else {
        uVar3 = 0;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          uVar3 = (ulong)*(uint *)((long)&local_e8 + lVar13 * 4) | uVar3 << 0x20;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar3;
          uVar3 = uVar3 % 1000000000;
          *(int *)((long)&local_e8 + lVar13 * 4) = SUB164(auVar1 / ZEXT816(1000000000),0);
        }
        uVar4 = local_e8 >> 0x20;
        uVar12 = local_e0;
        uVar15 = local_e8;
        if (uVar3 != 0) {
          uVar8 = uVar14;
          for (iVar11 = 8; -1 < iVar11; iVar11 = iVar11 + -1) {
            significand[uVar8] = (uint32_t)(uVar3 % 10);
            uVar8 = uVar8 - 1;
            uVar3 = uVar3 / 10;
          }
        }
      }
      uVar14 = uVar14 - 9;
    }
    uVar14 = 0x24;
    uVar10 = (uint)local_d8;
    for (; *__s == 0; __s = __s + 1) {
      uVar14 = uVar14 - 1;
    }
    cVar5 = (char)*__s + '0';
    str = local_d0;
  }
  else {
    __s = significand;
    significand[0] = 0;
    uVar14 = 1;
    cVar5 = '0';
  }
  if ((uVar7 < 0x1821) && (-7 < (int)(uVar14 + uVar10 + -1))) {
    if (uVar7 < 0x1820) {
      uVar10 = uVar10 + uVar14;
      if ((int)uVar10 < 1) {
        *pcVar6 = '0';
        pcVar6 = pcVar6 + 1;
      }
      else {
        for (uVar4 = 0; (uVar4 < uVar10 && ((long)(pcVar6 + (uVar4 - (long)str)) < 0x2b));
            uVar4 = uVar4 + 1) {
          uVar2 = *__s;
          __s = __s + 1;
          pcVar6[uVar4] = (char)uVar2 + '0';
        }
        pcVar6 = pcVar6 + uVar4;
      }
      *pcVar6 = '.';
      pcVar6 = pcVar6 + 1;
      lVar13 = (long)pcVar6 - (long)str;
      for (uVar7 = uVar10; (int)uVar7 < 0; uVar7 = uVar7 + 1) {
        *pcVar6 = '0';
        lVar13 = lVar13 + 1;
        pcVar6 = pcVar6 + 1;
      }
      uVar4 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      for (; (uVar4 < uVar14 - uVar10 && (lVar13 < 0x2b)); lVar13 = lVar13 + 1) {
        pcVar6[uVar4] = (char)__s[uVar4] + '0';
        uVar4 = uVar4 + 1;
      }
    }
    else {
      for (uVar4 = 0; (uVar4 < uVar14 && ((long)(pcVar6 + (uVar4 - (long)str)) < 0x24));
          uVar4 = uVar4 + 1) {
        pcVar6[uVar4] = (char)__s[uVar4] + '0';
      }
    }
    pcVar6[uVar4] = '\0';
    return;
  }
  *pcVar6 = cVar5;
  if (uVar14 - 1 == 0) {
    pcVar6 = pcVar6 + 1;
  }
  else {
    pcVar6[1] = '.';
    pcVar6 = pcVar6 + 2;
  }
  for (uVar4 = 0; (uVar4 < uVar14 - 1 && ((long)(pcVar6 + (uVar4 - (long)str)) < 0x24));
      uVar4 = uVar4 + 1) {
    pcVar6[uVar4] = (char)__s[uVar4 + 1] + '0';
  }
  pcVar6[uVar4] = 'E';
  bson_snprintf(pcVar6 + uVar4 + 1,6,"%+d");
  return;
}

Assistant:

void
bson_decimal128_to_string (const bson_decimal128_t *dec, /* IN  */
                           char *str)                    /* OUT */
{
   uint32_t COMBINATION_MASK = 0x1f;   /* Extract least significant 5 bits */
   uint32_t EXPONENT_MASK = 0x3fff;    /* Extract least significant 14 bits */
   uint32_t COMBINATION_INFINITY = 30; /* Value of combination field for Inf */
   uint32_t COMBINATION_NAN = 31;      /* Value of combination field for NaN */
   uint32_t EXPONENT_BIAS = 6176;      /* decimal128 exponent bias */

   char *str_out = str;      /* output pointer in string */
   char significand_str[35]; /* decoded significand digits */


   /* Note: bits in this routine are referred to starting at 0, */
   /* from the sign bit, towards the coefficient. */
   uint32_t high;                   /* bits 0 - 31 */
   uint32_t midh;                   /* bits 32 - 63 */
   uint32_t midl;                   /* bits 64 - 95 */
   uint32_t low;                    /* bits 96 - 127 */
   uint32_t combination;            /* bits 1 - 5 */
   uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
   uint32_t significand_digits = 0; /* the number of significand digits */
   uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
   uint32_t *significand_read = significand; /* read pointer into significand */
   int32_t exponent;                         /* unbiased exponent */
   int32_t scientific_exponent; /* the exponent if scientific notation is
                                 * used */
   bool is_zero = false;        /* true if the number is zero */

   uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
   _bson_uint128_t
      significand128; /* temporary storage for significand decoding */
   size_t i;          /* indexing variables */
   int j, k;

   memset (significand_str, 0, sizeof (significand_str));

   if ((int64_t) dec->high < 0) { /* negative */
      *(str_out++) = '-';
   }

   low = (uint32_t) dec->low, midl = (uint32_t) (dec->low >> 32),
   midh = (uint32_t) dec->high, high = (uint32_t) (dec->high >> 32);

   /* Decode combination field and exponent */
   combination = (high >> 26) & COMBINATION_MASK;

   if (BSON_UNLIKELY ((combination >> 3) == 3)) {
      /* Check for 'special' values */
      if (combination == COMBINATION_INFINITY) { /* Infinity */
         strcpy (str_out, BSON_DECIMAL128_INF);
         return;
      } else if (combination == COMBINATION_NAN) { /* NaN */
         /* str, not str_out, to erase the sign */
         strcpy (str, BSON_DECIMAL128_NAN);
         /* we don't care about the NaN payload. */
         return;
      } else {
         biased_exponent = (high >> 15) & EXPONENT_MASK;
         significand_msb = 0x8 + ((high >> 14) & 0x1);
      }
   } else {
      significand_msb = (high >> 14) & 0x7;
      biased_exponent = (high >> 17) & EXPONENT_MASK;
   }

   exponent = biased_exponent - EXPONENT_BIAS;
   /* Create string of significand digits */

   /* Convert the 114-bit binary number represented by */
   /* (high, midh, midl, low) to at most 34 decimal */
   /* digits through modulo and division. */
   significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
   significand128.parts[1] = midh;
   significand128.parts[2] = midl;
   significand128.parts[3] = low;

   if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
       significand128.parts[2] == 0 && significand128.parts[3] == 0) {
      is_zero = true;
   } else if (significand128.parts[0] >= (1 << 17)) {
      /* The significand is non-canonical or zero.
       * In order to preserve compatability with the densely packed decimal
       * format, the maximum value for the significand of decimal128 is
       * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
       * standard dictates that the significand is interpreted as zero.
       */
      is_zero = true;
   } else {
      for (k = 3; k >= 0; k--) {
         uint32_t least_digits = 0;
         _bson_uint128_divide1B (
            significand128, &significand128, &least_digits);

         /* We now have the 9 least significant digits (in base 2). */
         /* Convert and output to string. */
         if (!least_digits) {
            continue;
         }

         for (j = 8; j >= 0; j--) {
            significand[k * 9 + j] = least_digits % 10;
            least_digits /= 10;
         }
      }
   }

   /* Output format options: */
   /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
   /* Regular    - ddd.ddd */

   if (is_zero) {
      significand_digits = 1;
      *significand_read = 0;
   } else {
      significand_digits = 36;
      while (!(*significand_read)) {
         significand_digits--;
         significand_read++;
      }
   }

   scientific_exponent = significand_digits - 1 + exponent;

   /* The scientific exponent checks are dictated by the string conversion
    * specification and are somewhat arbitrary cutoffs.
    *
    * We must check exponent > 0, because if this is the case, the number
    * has trailing zeros.  However, we *cannot* output these trailing zeros,
    * because doing so would change the precision of the value, and would
    * change stored data if the string converted number is round tripped.
    */
   if (scientific_exponent < -6 || exponent > 0) {
      /* Scientific format */
      *(str_out++) = *(significand_read++) + '0';
      significand_digits--;

      if (significand_digits) {
         *(str_out++) = '.';
      }

      for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
         *(str_out++) = *(significand_read++) + '0';
      }
      /* Exponent */
      *(str_out++) = 'E';
      bson_snprintf (str_out, 6, "%+d", scientific_exponent);
   } else {
      /* Regular format with no decimal place */
      if (exponent >= 0) {
         for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      } else {
         int32_t radix_position = significand_digits + exponent;

         if (radix_position > 0) { /* non-zero digits before radix */
            for (i = 0;
                 i < radix_position && (str_out - str) < BSON_DECIMAL128_STRING;
                 i++) {
               *(str_out++) = *(significand_read++) + '0';
            }
         } else { /* leading zero before radix point */
            *(str_out++) = '0';
         }

         *(str_out++) = '.';
         while (radix_position++ < 0) { /* add leading zeros after radix */
            *(str_out++) = '0';
         }

         for (i = 0;
              (i < significand_digits - BSON_MAX (radix_position - 1, 0)) &&
              (str_out - str) < BSON_DECIMAL128_STRING;
              i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      }
   }
}